

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

char * sanitize_cookie_path(char *cookie_path)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (*Curl_cstrdup)(cookie_path);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    if (*pcVar1 == '\"') {
      sVar2 = strlen(pcVar1);
      memmove(pcVar1,pcVar1 + 1,sVar2);
    }
    sVar2 = strlen(pcVar1);
    if (pcVar1[sVar2 - 1] == '\"') {
      pcVar1[sVar2 - 1] = '\0';
    }
    if (*pcVar1 != '/') {
      (*Curl_cfree)(pcVar1);
      pcVar1 = (*Curl_cstrdup)("/");
      return pcVar1;
    }
    sVar2 = strlen(pcVar1);
    if ((1 < sVar2) && (pcVar1[sVar2 - 1] == '/')) {
      pcVar1[sVar2 - 1] = '\0';
    }
  }
  return pcVar1;
}

Assistant:

static char *sanitize_cookie_path(const char *cookie_path)
{
  size_t len;
  char *new_path = strdup(cookie_path);
  if(!new_path)
    return NULL;

  /* some stupid site sends path attribute with '"'. */
  if(new_path[0] == '\"') {
    memmove((void *)new_path, (const void *)(new_path + 1), strlen(new_path));
  }
  if(new_path[strlen(new_path) - 1] == '\"') {
    new_path[strlen(new_path) - 1] = 0x0;
  }

  /* RFC6265 5.2.4 The Path Attribute */
  if(new_path[0] != '/') {
    /* Let cookie-path be the default-path. */
    free(new_path);
    new_path = strdup("/");
    return new_path;
  }

  /* convert /hoge/ to /hoge */
  len = strlen(new_path);
  if(1 < len && new_path[len - 1] == '/') {
    new_path[len - 1] = 0x0;
  }

  return new_path;
}